

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O1

bool P_ClipLineToPortal(line_t_conflict *line,line_t_conflict *portal,DVector2 *view,bool partial,
                       bool samebehind)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar8 = (line->v1->p).X;
  dVar1 = (line->v1->p).Y;
  dVar11 = (portal->v1->p).X;
  dVar2 = (portal->v1->p).Y;
  dVar9 = (portal->delta).X;
  dVar3 = (portal->delta).Y;
  dVar10 = (dVar11 - dVar8) * dVar3 + (dVar1 - dVar2) * dVar9;
  uVar4 = (uint)(1.52587890625e-05 < dVar10);
  if (dVar10 < -1.52587890625e-05) {
    uVar4 = 0xffffffff;
  }
  dVar9 = (dVar11 - (line->v2->p).X) * dVar3 + ((line->v2->p).Y - dVar2) * dVar9;
  uVar7 = (uint)(1.52587890625e-05 < dVar9);
  if (dVar9 < -1.52587890625e-05) {
    uVar7 = 0xffffffff;
  }
  if (uVar7 != 0 || uVar4 != 0) {
    uVar5 = uVar4;
    if (uVar4 == 0) {
      uVar5 = uVar7;
    }
    if (uVar7 == 0) {
      uVar7 = uVar4;
      uVar5 = uVar4;
    }
    if (((int)uVar5 < 1) || ((int)uVar7 < 1)) {
      if ((int)(uVar5 & uVar7) < 0) {
        return false;
      }
      dVar9 = (line->delta).X;
      dVar3 = (line->delta).Y;
      dVar10 = (dVar8 - view->X) * dVar3 + (view->Y - dVar1) * dVar9;
      uVar4 = (uint)(1.52587890625e-05 < dVar10);
      if (dVar10 < -1.52587890625e-05) {
        uVar4 = 0xffffffff;
      }
      dVar11 = (dVar8 - dVar11) * dVar3 + (dVar2 - dVar1) * dVar9;
      uVar7 = (uint)(1.52587890625e-05 < dVar11);
      if (dVar11 < -1.52587890625e-05) {
        uVar7 = 0xffffffff;
      }
      dVar8 = (dVar8 - (portal->v2->p).X) * dVar3 + ((portal->v2->p).Y - dVar1) * dVar9;
      uVar5 = (uint)(1.52587890625e-05 < dVar8);
      if (dVar8 < -1.52587890625e-05) {
        uVar5 = 0xffffffff;
      }
      uVar6 = uVar7;
      if (uVar7 == 0) {
        uVar6 = uVar5;
      }
      return uVar4 != uVar6 && ((uVar7 == 0 || uVar5 == 0) || uVar5 == uVar7);
    }
  }
  return true;
}

Assistant:

bool P_ClipLineToPortal(line_t* line, line_t* portal, DVector2 view, bool partial, bool samebehind)
{
	int behind1 = P_GetLineSide(line->v1->fPos(), portal);
	int behind2 = P_GetLineSide(line->v2->fPos(), portal);

	if (behind1 == 0 && behind2 == 0)
	{
		// The line is parallel to the portal and cannot possibly be visible.
		return true;
	}
	// If one point lies on the same straight line than the portal, the other vertex will determine sidedness alone.
	else if (behind2 == 0) behind2 = behind1;
	else if (behind1 == 0) behind1 = behind2;

	if (behind1 > 0 && behind2 > 0)
	{
		// The line is behind the portal, i.e. between viewer and portal line, and must be rejected
		return true;
	}
	else if (behind1 < 0 && behind2 < 0)
	{
		// The line is in front of the portal, i.e. the portal is between viewer and line. This line must not be rejected
		return false;
	}
	else
	{
		// The line intersects with the portal straight, so we need to do another check to see how both ends of the portal lie in relation to the viewer.
		int viewside = P_GetLineSide(view, line); 
		int p1side = P_GetLineSide(portal->v1->fPos(), line);
		int p2side = P_GetLineSide(portal->v2->fPos(), line);
		// Do the same handling of points on the portal straight as above.
		if (p1side == 0) p1side = p2side;
		else if (p2side == 0) p2side = p1side;
		// If the portal is on the other side of the line than the viewpoint, there is no possibility to see this line inside the portal.
		return (p1side == p2side && viewside != p1side);
	}
}